

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O0

void * __thiscall pjson::pool_allocator::Alloc(pool_allocator *this,size_t size)

{
  chunk *pcVar1;
  size_t sVar2;
  ulong uVar3;
  uint local_44;
  ulong local_40;
  void *pRet;
  size_t alloc_size;
  chunk *pNew_chunk;
  size_t size_local;
  pool_allocator *this_local;
  
  uVar3 = size + 3 & 0xfffffffffffffffc;
  if ((this->m_pActive_chunks == (chunk *)0x0) ||
     (this->m_pActive_chunks->m_size - this->m_pActive_chunks->m_ofs < uVar3)) {
    alloc_size = (size_t)this->m_pFree_chunks;
    if (((chunk *)alloc_size == (chunk *)0x0) || (((chunk *)alloc_size)->m_size < uVar3)) {
      local_40 = uVar3;
      if (uVar3 < this->m_cur_grow_size) {
        local_40 = (ulong)this->m_cur_grow_size;
      }
      if (this->m_cur_grow_size << 1 < 0x800000) {
        local_44 = this->m_cur_grow_size << 1;
      }
      else {
        local_44 = 0x800000;
      }
      this->m_cur_grow_size = local_44;
      alloc_size = (size_t)pjson_malloc(local_40 + 0x18);
      *(ulong *)(alloc_size + 8) = local_40;
      *(undefined8 *)(alloc_size + 0x10) = 0;
    }
    else {
      if (this->m_total_free_bytes < ((chunk *)alloc_size)->m_size) {
        __assert_fail("m_total_free_bytes >= pNew_chunk->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0xc9,"void *pjson::pool_allocator::Alloc(size_t)");
      }
      this->m_total_free_bytes = this->m_total_free_bytes - ((chunk *)alloc_size)->m_size;
      this->m_pFree_chunks = ((chunk *)alloc_size)->m_pNext;
      if (((chunk *)alloc_size)->m_ofs != 0) {
        __assert_fail("!pNew_chunk->m_ofs",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0xcc,"void *pjson::pool_allocator::Alloc(size_t)");
      }
    }
    *(chunk **)alloc_size = this->m_pActive_chunks;
    this->m_pActive_chunks = (chunk *)alloc_size;
  }
  pcVar1 = this->m_pActive_chunks;
  sVar2 = this->m_pActive_chunks->m_ofs;
  this->m_pActive_chunks->m_ofs = uVar3 + this->m_pActive_chunks->m_ofs;
  if (this->m_pActive_chunks->m_size < this->m_pActive_chunks->m_ofs) {
    __assert_fail("m_pActive_chunks->m_ofs <= m_pActive_chunks->m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                  ,0xdd,"void *pjson::pool_allocator::Alloc(size_t)");
  }
  return (void *)((long)&pcVar1[1].m_pNext + sVar2);
}

Assistant:

inline void* Alloc(size_t size)
      {
         size = (size + 3) & ~3;
         if ((!m_pActive_chunks) || ((m_pActive_chunks->m_size - m_pActive_chunks->m_ofs) < size))
         {
            chunk* pNew_chunk = m_pFree_chunks;
            if ((pNew_chunk) && (pNew_chunk->m_size >= size))
            {
               PJSON_ASSERT(m_total_free_bytes >= pNew_chunk->m_size);
               m_total_free_bytes -= pNew_chunk->m_size;
               m_pFree_chunks = pNew_chunk->m_pNext;
               PJSON_ASSERT(!pNew_chunk->m_ofs);
            }
            else
            {
               size_t alloc_size = PJSON_MAX(size, m_cur_grow_size);
               m_cur_grow_size = PJSON_MIN(m_cur_grow_size * 2, PJSON_MAX_CHUNK_GROW_SIZE);

               pNew_chunk = static_cast<chunk*>(pjson_malloc(sizeof(chunk) + alloc_size));
               pNew_chunk->m_size = alloc_size;
               pNew_chunk->m_ofs = 0;
            }

            pNew_chunk->m_pNext = m_pActive_chunks;
            m_pActive_chunks = pNew_chunk;
         }
         void* pRet = (uint8*)m_pActive_chunks + sizeof(chunk) + m_pActive_chunks->m_ofs;
         m_pActive_chunks->m_ofs += size;
         PJSON_ASSERT(m_pActive_chunks->m_ofs <= m_pActive_chunks->m_size);
         return pRet;
      }